

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O1

int __thiscall
CLayer::GetWireInOverFlowBoundary
          (CLayer *this,
          hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
          *pWireList)

{
  int iVar1;
  CBoundary *this_00;
  pointer ppCVar2;
  pointer ppCVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  reference pvVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_header *p_Var9;
  pointer ppCVar10;
  bool bVar11;
  value_type local_40;
  
  p_Var8 = (this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var9) {
    iVar1 = *(int *)&CObject::m_pDesign->field_0xc4c;
    do {
      this_00 = (CBoundary *)p_Var8[1]._M_parent;
      iVar5 = CBoundary::GetOverFlow(this_00);
      ppCVar2 = (this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar3 = (this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar2 != ppCVar3) {
        uVar6 = (long)ppCVar3 - (long)ppCVar2 >> 3;
        lVar4 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<CWire**,std::vector<CWire*,std::allocator<CWire*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<CWireOpLen>>
                  (ppCVar2,ppCVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<CWire**,std::vector<CWire*,std::allocator<CWire*>>>,__gnu_cxx::__ops::_Iter_comp_iter<CWireOpLen>>
                  (ppCVar2,ppCVar3);
      }
      ppCVar2 = (this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar3 = (this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar2 != ppCVar3) {
        iVar5 = iVar5 * iVar1;
        do {
          ppCVar10 = ppCVar2 + 1;
          local_40.first = (longlong)*ppCVar2;
          local_40.second = 0;
          pvVar7 = __gnu_cxx::
                   hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                   ::find_or_insert(&pWireList->_M_ht,&local_40);
          pvVar7->second = pvVar7->second + 1;
          bVar11 = iVar5 == 0;
          iVar5 = iVar5 + -1;
          if (bVar11) break;
          ppCVar2 = ppCVar10;
        } while (ppCVar10 != ppCVar3);
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var9);
  }
  return (int)(pWireList->_M_ht)._M_num_elements;
}

Assistant:

int CLayer::GetWireInOverFlowBoundary(hash_map<ADDRESS,int>* pWireList)
{
	int	iReRouting_Step		=	GetDesign()->m_Param.m_iReRouting_Step;
	for(multimap<int, CBoundary*>::iterator itr=m_CBoundaryBucket.begin(),end=m_CBoundaryBucket.end();itr!=end;++itr)
	{
		vector<CNet*>	NetList;
		CBoundary*	pBoundary	=	itr->second;

		int	iNumOF	=	pBoundary->GetOverFlow()*iReRouting_Step;

		sort(pBoundary->m_Wire.begin(),pBoundary->m_Wire.end(),CWireOpLen());
		for(vector<CWire*>::iterator itrw=pBoundary->m_Wire.begin(),end=pBoundary->m_Wire.end();itrw!=end;++itrw)
		{
			++(*pWireList)[(ADDRESS)(*itrw)];
			if(iNumOF--==0)	break;
		}
	}

	return	pWireList->size();
}